

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

Vec_Int_t * Gla_ManCollectPPis(Gla_Man_t *p,Vec_Int_t *vPis)

{
  Gla_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  size_t __nmemb;
  long lVar10;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  pVVar5 = p->vAbs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      lVar6 = (long)pVVar5->pArray[lVar10];
      if ((lVar6 < 0) || (p->nObjs <= pVVar5->pArray[lVar10])) {
LAB_006016fe:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if ((pGVar1[lVar6].field_0x4 & 0xa4) == 0) {
        __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x4dc,"Vec_Int_t *Gla_ManCollectPPis(Gla_Man_t *, Vec_Int_t *)");
      }
      if (0x1ff < *(uint *)&pGVar1[lVar6].field_0x4) {
        uVar9 = 0;
        do {
          iVar2 = pGVar1[lVar6].Fanins[uVar9];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_006016fe;
          if ((p->pObjs[iVar2].field_0x4 & 9) == 0) {
            Vec_IntPush(p_00,iVar2);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < *(uint *)&pGVar1[lVar6].field_0x4 >> 9);
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->vAbs;
    } while (lVar10 < pVVar5->nSize);
  }
  __nmemb = (size_t)p_00->nSize;
  if (1 < (long)__nmemb) {
    piVar4 = p_00->pArray;
    qsort(piVar4,__nmemb,4,Vec_IntSortCompare1);
    iVar2 = 1;
    sVar7 = 1;
    do {
      if (piVar4[sVar7] != piVar4[sVar7 - 1]) {
        lVar10 = (long)iVar2;
        iVar2 = iVar2 + 1;
        piVar4[lVar10] = piVar4[sVar7];
      }
      sVar7 = sVar7 + 1;
    } while (__nmemb != sVar7);
    p_00->nSize = iVar2;
  }
  uVar3 = p_00->nSize;
  if (1 < (int)uVar3) {
    piVar4 = p_00->pArray;
    uVar8 = uVar3 >> 1;
    uVar9 = 0;
    do {
      uVar3 = uVar3 - 1;
      iVar2 = piVar4[uVar9];
      piVar4[uVar9] = piVar4[(int)uVar3];
      piVar4[(int)uVar3] = iVar2;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gla_ManCollectPPis( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Vec_Int_t * vPPis;
    Gla_Obj_t * pObj, * pFanin;
    int i, k;
    vPPis = Vec_IntAlloc( 1000 );
    if ( vPis )
        Vec_IntClear( vPis );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPPis, pObj->Fanins[k] );
            else if ( vPis && pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPis, pObj->Fanins[k] );
    }
    Vec_IntUniqify( vPPis );
    Vec_IntReverseOrder( vPPis );
    if ( vPis )
        Vec_IntUniqify( vPis );
    return vPPis;
}